

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMNode.hpp
# Opt level: O1

CMStateSet * __thiscall xercesc_4_0::CMNode::getFirstPos(CMNode *this)

{
  CMStateSet *this_00;
  
  if (this->fFirstPos == (CMStateSet *)0x0) {
    this_00 = (CMStateSet *)XMemory::operator_new(0x20,this->fMemoryManager);
    CMStateSet::CMStateSet(this_00,(ulong)this->fMaxStates,this->fMemoryManager);
    this->fFirstPos = this_00;
    (*this->_vptr_CMNode[3])(this,this_00);
  }
  return this->fFirstPos;
}

Assistant:

inline const CMStateSet& CMNode::getFirstPos()
{
    //
    //  Fault in the state set if needed. Since we can't use mutable members
    //  cast off the const'ness.
    //
    if (!fFirstPos)
    {
        fFirstPos = new (fMemoryManager) CMStateSet(fMaxStates, fMemoryManager);
        calcFirstPos(*fFirstPos);
    }
    return *fFirstPos;
}